

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ImageButtonEx
               (ImGuiID id,ImTextureID texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,
               ImVec2 *padding,ImVec4 *bg_col,ImVec4 *tint_col)

{
  bool bVar1;
  ImU32 IVar2;
  ImVec2 IVar3;
  ImVec2 *in_RCX;
  ImVec4 *in_RSI;
  ImVec2 *pIVar4;
  ImVec2 *in_R8;
  ImRect *in_R9;
  float v;
  float fVar5;
  ImVec2 IVar6;
  long in_stack_00000008;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  ImRect bb;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  ImDrawCornerFlags in_stack_ffffffffffffff24;
  undefined8 in_stack_ffffffffffffff28;
  ImVec4 *in_stack_ffffffffffffff30;
  ImRect *in_stack_ffffffffffffff38;
  ImDrawList *in_stack_ffffffffffffff40;
  ImRect *in_stack_ffffffffffffff48;
  undefined4 uVar7;
  ImGuiButtonFlags flags;
  bool *in_stack_ffffffffffffff60;
  bool *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  ImGuiID id_00;
  ImRect *in_stack_ffffffffffffff78;
  byte local_6a;
  byte local_69;
  float in_stack_ffffffffffffffb0;
  undefined1 border;
  float in_stack_ffffffffffffffb4;
  ImVec2 in_stack_ffffffffffffffb8;
  ImGuiContext *pIVar8;
  bool local_1;
  
  id_00 = (ImGuiID)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  border = (undefined1)((uint)in_stack_ffffffffffffffb0 >> 0x18);
  pIVar8 = GImGui;
  IVar3 = (ImVec2)GetCurrentWindow();
  if ((*(bool *)((long)IVar3 + 0x93) & 1U) == 0) {
    pIVar4 = (ImVec2 *)((long)IVar3 + 0xd8);
    operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
              (ImVec2 *)0x193864);
    operator*((ImVec2 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0.0);
    IVar6 = operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      (ImVec2 *)0x1938a0);
    fVar5 = IVar6.y;
    ImRect::ImRect((ImRect *)&stack0xffffffffffffffb0,pIVar4,(ImVec2 *)&stack0xffffffffffffffa8);
    flags = (ImGuiButtonFlags)((ulong)pIVar4 >> 0x20);
    ItemSize((ImRect *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c);
    bVar1 = ItemAdd(in_stack_ffffffffffffff48,(ImGuiID)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                    in_stack_ffffffffffffff38);
    if (bVar1) {
      local_1 = ButtonBehavior(in_stack_ffffffffffffff78,id_00,in_stack_ffffffffffffff68,
                               in_stack_ffffffffffffff60,flags);
      if (((local_6a & 1) == 0) || ((local_69 & 1) == 0)) {
        uVar7 = 0x15;
        if ((local_69 & 1) != 0) {
          uVar7 = 0x16;
        }
      }
      else {
        uVar7 = 0x17;
      }
      IVar2 = GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                          SUB84(in_stack_ffffffffffffff30,0));
      RenderNavHighlight(in_R9,(ImGuiID)((ulong)pIVar8 >> 0x20),(ImGuiNavHighlightFlags)pIVar8);
      v = ImMin<float>((in_R9->Min).x,(in_R9->Min).y);
      ImClamp<float>(v,0.0,(pIVar8->Style).FrameRounding);
      RenderFrame(IVar3,in_stack_ffffffffffffffb8,(ImU32)in_stack_ffffffffffffffb4,(bool)border,
                  fVar5);
      if (0.0 < *(float *)(in_stack_00000008 + 0xc)) {
        in_stack_ffffffffffffff48 = *(ImRect **)((long)IVar3 + 0x2b8);
        operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                  (ImVec2 *)0x193a32);
        operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                  (ImVec2 *)0x193a4d);
        GetColorU32(in_stack_ffffffffffffff30);
        ImDrawList::AddRectFilled
                  (in_stack_ffffffffffffff40,&in_stack_ffffffffffffff38->Min,
                   (ImVec2 *)in_stack_ffffffffffffff30,
                   (ImU32)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                   (float)in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
      }
      pIVar4 = *(ImVec2 **)((long)IVar3 + 0x2b8);
      operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                (ImVec2 *)0x193ab5);
      IVar3 = operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                        (ImVec2 *)0x193ad0);
      fVar5 = IVar3.x;
      GetColorU32(in_RSI);
      ImDrawList::AddImage
                ((ImDrawList *)CONCAT44(uVar7,IVar2),in_stack_ffffffffffffff48,in_R8,in_RCX,
                 (ImVec2 *)in_RSI,pIVar4,(ImU32)fVar5);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ImageButtonEx(ImGuiID id, ImTextureID texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, const ImVec2& padding, const ImVec4& bg_col, const ImVec4& tint_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size + padding * 2);
    ItemSize(bb);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, col, true, ImClamp((float)ImMin(padding.x, padding.y), 0.0f, g.Style.FrameRounding));
    if (bg_col.w > 0.0f)
        window->DrawList->AddRectFilled(bb.Min + padding, bb.Max - padding, GetColorU32(bg_col));
    window->DrawList->AddImage(texture_id, bb.Min + padding, bb.Max - padding, uv0, uv1, GetColorU32(tint_col));

    return pressed;
}